

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O2

void __thiscall UnifiedRegex::CharBitvec::SetRange(CharBitvec *this,uint l,uint h)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint h_00;
  
  if (0xff < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x5b,"(l < Size)","l < Size");
    if (!bVar2) goto LAB_00cdafc9;
    *puVar3 = 0;
  }
  if (0xff < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x5c,"(h < Size)","h < Size");
    if (!bVar2) {
LAB_00cdafc9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((h | l) < 0x100) {
    if (l == h) {
      this->vec[l >> 5] = this->vec[l >> 5] | 1 << ((byte)l & 0x1f);
    }
    else if (l < h) {
      uVar5 = l >> 5;
      h_00 = h & 0x1f;
      if (uVar5 == h >> 5) {
        setrng(this->vec + uVar5,l & 0x1f,h_00);
        return;
      }
      setrng(this->vec + uVar5,l & 0x1f,0x1f);
      uVar4 = (ulong)(h >> 5);
      uVar6 = (ulong)uVar5;
      while (uVar6 + 1 < uVar4) {
        this->vec[uVar6 + 1] = 0xffffffff;
        uVar6 = uVar6 + 1;
      }
      if (h_00 == 0x1f) {
        uVar5 = 0xffffffff;
      }
      else {
        uVar5 = ~(-2 << (sbyte)h_00) | this->vec[uVar4];
      }
      this->vec[uVar4] = uVar5;
    }
  }
  return;
}

Assistant:

inline void SetRange(uint l, uint h)
        {
            Assert(l < Size);
            Assert(h < Size);
            __assume(l < Size);
            __assume(h < Size);
            if (l < Size && h < Size)
            {
                if (l == h)
                {
                    vec[l / wordSize] |= 1U << (l % wordSize);
                }
                else if (l < h)
                {
                    int lw = l / wordSize;
                    int hw = h / wordSize;
                    int lo = l % wordSize;
                    int hio = h % wordSize;
                    if (lw == hw)
                    {
                        setrng(vec[lw], lo, hio);
                    }
                    else
                    {
                        setrng(vec[lw], lo, wordSize - 1);
                        for (int w = lw + 1; w < hw; w++)
                        {
                            vec[w] = ones;
                        }
                        setrng(vec[hw], 0, hio);
                    }
                }
            }
        }